

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaReadBlif.c
# Opt level: O0

Vec_Ptr_t * Prs_ManReadBlif(char *pFileName)

{
  int iVar1;
  Prs_Man_t *p_00;
  Vec_Ptr_t *t;
  Prs_Man_t *p;
  Vec_Ptr_t *vPrs;
  char *pFileName_local;
  
  p = (Prs_Man_t *)0x0;
  p_00 = Prs_ManAlloc(pFileName);
  if (p_00 == (Prs_Man_t *)0x0) {
    pFileName_local = (char *)0x0;
  }
  else {
    Abc_NamStrFindOrAdd(p_00->pFuns," 0\n",(int *)0x0);
    Abc_NamStrFindOrAdd(p_00->pFuns," 1\n",(int *)0x0);
    Prs_NtkAddBlifDirectives(p_00);
    Prs_ManReadLines(p_00);
    iVar1 = Prs_ManErrorPrint(p_00);
    if (iVar1 != 0) {
      p = (Prs_Man_t *)p_00->vNtks;
      p_00->vNtks = (Vec_Ptr_t *)0x0;
    }
    Prs_ManFree(p_00);
    pFileName_local = (char *)p;
  }
  return (Vec_Ptr_t *)pFileName_local;
}

Assistant:

Vec_Ptr_t * Prs_ManReadBlif( char * pFileName )
{
    Vec_Ptr_t * vPrs = NULL;
    Prs_Man_t * p = Prs_ManAlloc( pFileName );
    if ( p == NULL )
        return NULL;
    Abc_NamStrFindOrAdd( p->pFuns, " 0\n", NULL );
    Abc_NamStrFindOrAdd( p->pFuns, " 1\n", NULL );
    Prs_NtkAddBlifDirectives( p );
    Prs_ManReadLines( p );
    if ( Prs_ManErrorPrint(p) )
        ABC_SWAP( Vec_Ptr_t *, vPrs, p->vNtks );
    Prs_ManFree( p );
    return vPrs;
}